

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitArrayInit
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,ArrayInit *curr)

{
  char **ppcVar1;
  Module *this_00;
  uint uVar2;
  Literal *pLVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  uint64_t uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  long lVar7;
  DataSegment *pDVar8;
  size_type sVar9;
  ElementSegment *pEVar10;
  Literal *other;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  shared_ptr<wasm::GCData> sVar12;
  undefined1 local_1e8 [8];
  Flow ref;
  Flow index;
  Flow offset;
  Flow size;
  undefined1 auStack_78 [8];
  Field elem;
  undefined1 local_58 [8];
  shared_ptr<wasm::GCData> data;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_1e8,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->ref);
  if (ref.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&ref.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->index);
    if (index.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&index.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->offset);
      if (offset.breakTo.super_IString.str._M_len == 0) {
        ExpressionRunner<wasm::ModuleRunner>::visit
                  ((Flow *)&offset.breakTo.super_IString.str._M_str,
                   &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->size);
        if (size.breakTo.super_IString.str._M_len == 0) {
          Flow::getSingleValue((Flow *)local_1e8);
          sVar12 = Literal::getGCData((Literal *)local_58);
          if (local_58 == (undefined1  [8])0x0) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"null ref",
                       sVar12.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
          }
          pLVar3 = Flow::getSingleValue((Flow *)&ref.breakTo.super_IString.str._M_str);
          p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Literal::getUnsigned(pLVar3);
          pLVar3 = Flow::getSingleValue((Flow *)&index.breakTo.super_IString.str._M_str);
          uVar5 = Literal::getUnsigned(pLVar3);
          pLVar3 = Flow::getSingleValue((Flow *)&offset.breakTo.super_IString.str._M_str);
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Literal::getUnsigned(pLVar3);
          lVar7 = (long)(((Literals *)((long)local_58 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                        flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(((Literals *)((long)local_58 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                        flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          if (lVar7 / 0x18 +
              (((Literals *)((long)local_58 + 8))->super_SmallVector<wasm::Literal,_1UL>).usedFixed
              < (ulong)((long)&p_Var4->_vptr__Sp_counted_base + (long)p_Var6)) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds array access in array.init",lVar7 % 0x18);
          }
          this_00 = (this->super_ExpressionRunner<wasm::ModuleRunner>).module;
          if (curr->op == InitElem) {
            pEVar10 = Module::getElementSegment(this_00,(Name)(curr->segment).super_IString.str);
            if ((ulong)((long)(pEVar10->data).
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pEVar10->data).
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) <
                (long)&p_Var6->_vptr__Sp_counted_base + uVar5) {
              (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                        (this,"out of bounds segment access in array.init");
            }
            lVar7 = (long)p_Var4 * 0x18 + -0x18;
            ppcVar1 = &size.breakTo.super_IString.str._M_str;
            data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 p_Var6;
            for (p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                != p_Var11;
                p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&p_Var11->_vptr__Sp_counted_base + 1)) {
              ExpressionRunner<wasm::ModuleRunner>::visit
                        ((Flow *)ppcVar1,&this->super_ExpressionRunner<wasm::ModuleRunner>,
                         (pEVar10->data).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)p_Var11]);
              other = Flow::getSingleValue((Flow *)ppcVar1);
              pLVar3 = (((Literals *)((long)local_58 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                       fixed._M_elems;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)-(long)p_Var4 != p_Var11) {
                pLVar3 = (Literal *)
                         ((long)&((((Literals *)((long)local_58 + 8))->
                                  super_SmallVector<wasm::Literal,_1UL>).flexible.
                                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar7);
              }
              Literal::operator=(pLVar3,other);
              SmallVector<wasm::Literal,_1UL>::~SmallVector
                        ((SmallVector<wasm::Literal,_1UL> *)ppcVar1);
              lVar7 = lVar7 + 0x18;
            }
          }
          else {
            if (curr->op != InitData) {
              handle_unreachable("unexpected op",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                                 ,0xe71);
            }
            pDVar8 = Module::getDataSegment(this_00,(Name)(curr->segment).super_IString.str);
            wasm::Type::getHeapType(&curr->ref->type);
            HeapType::getArray((HeapType *)&size.breakTo.super_IString.str._M_str);
            auStack_78 = (undefined1  [8])size.breakTo.super_IString.str._M_str;
            uVar2 = Field::getByteSize((Field *)auStack_78);
            if ((ulong)((long)(pDVar8->data).super__Vector_base<char,_std::allocator<char>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                       (long)(pDVar8->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start) < (long)p_Var6 * (ulong)uVar2 + uVar5
               ) {
              (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                        (this,"out of bounds segment access in array.init_data");
            }
            if ((long)&p_Var6->_vptr__Sp_counted_base + uVar5 != 0) {
              sVar9 = std::
                      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::count(&(this->droppedSegments)._M_h,&curr->segment);
              if (sVar9 != 0) {
                (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                          (this,"out of bounds segment access in array.init_data");
              }
            }
            data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)-(long)p_Var6;
            lVar7 = (long)p_Var4 * 0x18 + -0x18;
            ppcVar1 = &size.breakTo.super_IString.str._M_str;
            for (p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                != p_Var6;
                p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&p_Var6[-1]._M_weak_count + 3)) {
              Literal::makeFromMemory
                        ((Literal *)ppcVar1,
                         (pDVar8->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar5,(Field *)auStack_78);
              pLVar3 = (((Literals *)((long)local_58 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                       fixed._M_elems;
              if (p_Var4 != p_Var6) {
                pLVar3 = (Literal *)
                         ((long)&((((Literals *)((long)local_58 + 8))->
                                  super_SmallVector<wasm::Literal,_1UL>).flexible.
                                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar7);
              }
              Literal::operator=(pLVar3,(Literal *)ppcVar1);
              Literal::~Literal((Literal *)ppcVar1);
              uVar5 = uVar5 + uVar2;
              lVar7 = lVar7 + 0x18;
            }
          }
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
        }
        else {
          Flow::Flow(__return_storage_ptr__,(Flow *)&offset.breakTo.super_IString.str._M_str);
        }
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&offset.breakTo.super_IString.str._M_str);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&index.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&index.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ref.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_1e8);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_1e8);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayInit(ArrayInit* curr) {
    NOTE_ENTER("ArrayInit");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    Flow offset = self()->visit(curr->offset);
    if (offset.breaking()) {
      return offset;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    size_t indexVal = index.getSingleValue().getUnsigned();
    size_t offsetVal = offset.getSingleValue().getUnsigned();
    size_t sizeVal = size.getSingleValue().getUnsigned();

    size_t arraySize = data->values.size();
    if ((uint64_t)indexVal + sizeVal > arraySize) {
      trap("out of bounds array access in array.init");
    }

    Module& wasm = *self()->getModule();

    switch (curr->op) {
      case InitData: {
        auto* seg = wasm.getDataSegment(curr->segment);
        auto elem = curr->ref->type.getHeapType().getArray().element;
        size_t elemSize = elem.getByteSize();
        uint64_t readSize = (uint64_t)sizeVal * elemSize;
        if (offsetVal + readSize > seg->data.size()) {
          trap("out of bounds segment access in array.init_data");
        }
        if (offsetVal + sizeVal > 0 && droppedSegments.count(curr->segment)) {
          trap("out of bounds segment access in array.init_data");
        }
        for (size_t i = 0; i < sizeVal; i++) {
          void* addr = (void*)&seg->data[offsetVal + i * elemSize];
          data->values[indexVal + i] = Literal::makeFromMemory(addr, elem);
        }
        return {};
      }
      case InitElem: {
        auto* seg = wasm.getElementSegment(curr->segment);
        if ((uint64_t)offsetVal + sizeVal > seg->data.size()) {
          trap("out of bounds segment access in array.init");
        }
        // TODO: Check whether the segment has been dropped once we support
        // dropping element segments.
        for (size_t i = 0; i < sizeVal; i++) {
          // TODO: This is not correct because it does not preserve the identity
          // of references in the table! ArrayNewSeg suffers the same problem.
          // Fixing it will require changing how we represent segments, at least
          // in the interpreter.
          data->values[indexVal + i] =
            self()->visit(seg->data[i]).getSingleValue();
        }
        return {};
      }
    };
    WASM_UNREACHABLE("unexpected op");
  }